

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

ostream * mjs::operator<<(ostream *os,string *s)

{
  ostream *poVar1;
  wstring_view wVar2;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  wVar2 = string::view(s);
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<wchar_t_const*>
            ((string *)local_30,wVar2._M_str,wVar2._M_str + wVar2._M_len);
  poVar1 = std::operator<<(os,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const string& s) {
    auto v = s.view();
    return os << std::string(v.begin(), v.end());
}